

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O3

int oonf_cfg_apply(void)

{
  cfg_db *pre_change;
  cfg_db *pcVar1;
  int iVar2;
  cfg_db *dst;
  cfg_db *pcVar3;
  int iVar4;
  autobuf log;
  char *format;
  autobuf local_50;
  
  iVar2 = abuf_init(&local_50);
  if (iVar2 != 0) {
    if ((log_global_mask[3] & 4) == 0) {
      return -1;
    }
    oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15a,(void *)0x0,0,
             "Not enough memory for logging autobuffer");
    return -1;
  }
  if ((log_global_mask[3] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15e,(void *)0x0,0,
             "Apply configuration");
  }
  iVar2 = oonf_cfg_update_globalcfg(true);
  if (iVar2 != 0) {
    iVar4 = -1;
    pcVar1 = _oonf_work_db;
    if ((log_global_mask[3] & 4) == 0) goto LAB_0012b80e;
    format = "Updating global config failed";
    iVar2 = 0x165;
LAB_0012b7f1:
    iVar4 = -1;
    oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",iVar2,(void *)0x0,0,format);
    pcVar1 = _oonf_work_db;
    goto LAB_0012b80e;
  }
  iVar2 = oonf_cfg_load_subsystems();
  iVar4 = -1;
  pcVar1 = _oonf_work_db;
  if (iVar2 != 0) goto LAB_0012b80e;
  iVar2 = cfg_schema_validate(_oonf_raw_db,false,(_Bool)(config_global.failfast ^ 1),&local_50);
  pre_change = _oonf_work_db;
  pcVar3 = _oonf_raw_db;
  pcVar1 = pre_change;
  if (iVar2 != 0) {
    if ((log_global_mask[3] & 4) == 0) goto LAB_0012b80e;
    format = "Configuration validation failed: %s";
    iVar2 = 0x170;
    goto LAB_0012b7f1;
  }
  dst = cfg_db_add();
  if (dst != (cfg_db *)0x0) {
    iVar2 = _cfg_db_append(dst,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    if (iVar2 == 0) {
      _oonf_work_db = dst;
      dst->schema = &_oonf_schema;
      cfg_schema_validate(dst,true,false,(autobuf *)0x0);
      iVar2 = oonf_cfg_update_globalcfg(false);
      if (iVar2 == 0) {
        if (_first_apply == '\x01') {
          iVar2 = cfg_schema_handle_db_startup_changes(_oonf_work_db);
          if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
            oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",399,(void *)0x0,0,
                     "Handling changes failes");
          }
          _first_apply = '\0';
        }
        else {
          iVar2 = cfg_schema_handle_db_changes(pre_change,_oonf_work_db);
          if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
            oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x195,(void *)0x0,0,
                     "Handling changes failes");
          }
        }
        iVar4 = 0;
        _trigger_reload = 0;
        _trigger_commit = 0;
        cfg_db_remove(_oonf_raw_db);
        pcVar1 = _oonf_work_db;
        pcVar3 = cfg_db_add();
        if (pcVar3 == (cfg_db *)0x0) {
LAB_0012ba5e:
          pcVar3 = (cfg_db *)0x0;
        }
        else {
          iVar2 = _cfg_db_append(pcVar3,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0);
          if (iVar2 != 0) {
            cfg_db_remove(pcVar3);
            goto LAB_0012ba5e;
          }
        }
        _oonf_raw_db = pcVar3;
        pcVar3->schema = &_oonf_schema;
      }
      else {
        iVar4 = -1;
        if ((log_global_mask[3] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x188,(void *)0x0,0,
                   "Updating global config failed");
        }
      }
      pcVar1 = _oonf_work_db;
      if (pre_change != (cfg_db *)0x0) {
        cfg_db_remove(pre_change);
        pcVar1 = _oonf_work_db;
      }
      goto LAB_0012b80e;
    }
    cfg_db_remove(dst);
  }
  _oonf_work_db = (cfg_db *)0x0;
  if ((log_global_mask[3] & 4) != 0) {
    oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x17a,(void *)0x0,0,
             "Not enough memory for duplicating work db");
  }
LAB_0012b80e:
  _oonf_work_db = pcVar1;
  abuf_free(&local_50);
  return iVar4;
}

Assistant:

int
oonf_cfg_apply(void) {
  struct cfg_db *old_db;
  struct autobuf log;
  int result;

  if (abuf_init(&log)) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for logging autobuffer");
    return -1;
  }

  OONF_INFO(LOG_CONFIG, "Apply configuration");

  /*** phase 1: activate all plugins ***/
  result = -1;
  old_db = NULL;

  if (oonf_cfg_update_globalcfg(true)) {
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  if (oonf_cfg_load_subsystems()) {
    goto apply_failed;
  }

  /*** phase 2: check configuration and apply it ***/
  /* validate configuration data */
  if (cfg_schema_validate(_oonf_raw_db, false, !config_global.failfast, &log)) {
    OONF_WARN(LOG_CONFIG, "Configuration validation failed: %s", abuf_getptr(&log));
    goto apply_failed;
  }

  /* backup old db */
  old_db = _oonf_work_db;

  /* create new configuration database with correct values */
  _oonf_work_db = cfg_db_duplicate(_oonf_raw_db);
  if (_oonf_work_db == NULL) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for duplicating work db");
    _oonf_work_db = old_db;
    old_db = NULL;
    goto apply_failed;
  }

  /* bind schema */
  cfg_db_link_schema(_oonf_work_db, &_oonf_schema);

  /* remove everything not valid */
  cfg_schema_validate(_oonf_work_db, true, false, NULL);

  if (oonf_cfg_update_globalcfg(false)) {
    /* this should not happen at all */
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  /* calculate delta and call handlers */
  if (_first_apply) {
    if (cfg_schema_handle_db_startup_changes(_oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
    _first_apply = false;
  }
  else {
    if (cfg_schema_handle_db_changes(old_db, _oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
  }

  /* success */
  result = 0;
  _trigger_reload = false;
  _trigger_commit = false;

  /* now get a new working copy of the committed settings */
  cfg_db_remove(_oonf_raw_db);
  _oonf_raw_db = cfg_db_duplicate(_oonf_work_db);
  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);

apply_failed:
  if (old_db) {
    cfg_db_remove(old_db);
  }

  abuf_free(&log);
  return result;
}